

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiguresTests.cpp
# Opt level: O2

void __thiscall agge::tests::RectangleTests::RectangleProducesIterator(RectangleTests *this)

{
  allocator local_79;
  int local_78 [2];
  real_t y;
  real_t x;
  string local_68;
  LocationInfo local_48;
  rectangle r;
  
  rectangle::rectangle(&r,10.0,20.0,30.0,40.0);
  local_78[1] = 1;
  local_78[0] = rectangle::vertex(&r,&x,&y);
  std::__cxx11::string::string
            ((string *)&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,&local_79);
  ut::LocationInfo::LocationInfo(&local_48,&local_68,0x5e);
  ut::are_equal<agge::path_commands,int>((path_commands *)(local_78 + 1),local_78,&local_48);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_78[1] = 2;
  local_78[0] = rectangle::vertex(&r,&x,&y);
  std::__cxx11::string::string
            ((string *)&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,&local_79);
  ut::LocationInfo::LocationInfo(&local_48,&local_68,0x5f);
  ut::are_equal<agge::path_commands,int>((path_commands *)(local_78 + 1),local_78,&local_48);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_78[1] = 2;
  local_78[0] = rectangle::vertex(&r,&x,&y);
  std::__cxx11::string::string
            ((string *)&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,&local_79);
  ut::LocationInfo::LocationInfo(&local_48,&local_68,0x60);
  ut::are_equal<agge::path_commands,int>((path_commands *)(local_78 + 1),local_78,&local_48);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_78[1] = 2;
  local_78[0] = rectangle::vertex(&r,&x,&y);
  std::__cxx11::string::string
            ((string *)&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,&local_79);
  ut::LocationInfo::LocationInfo(&local_48,&local_68,0x61);
  ut::are_equal<agge::path_commands,int>((path_commands *)(local_78 + 1),local_78,&local_48);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_78[1] = 0x30;
  local_78[0] = rectangle::vertex(&r,&x,&y);
  std::__cxx11::string::string
            ((string *)&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,&local_79);
  ut::LocationInfo::LocationInfo(&local_48,&local_68,0x62);
  ut::are_equal<int,int>(local_78 + 1,local_78,&local_48);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_78[1] = 0;
  local_78[0] = rectangle::vertex(&r,&x,&y);
  std::__cxx11::string::string
            ((string *)&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,&local_79);
  ut::LocationInfo::LocationInfo(&local_48,&local_68,99);
  ut::are_equal<agge::path_commands,int>((path_commands *)(local_78 + 1),local_78,&local_48);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_78[1] = 0;
  local_78[0] = rectangle::vertex(&r,&x,&y);
  std::__cxx11::string::string
            ((string *)&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,&local_79);
  ut::LocationInfo::LocationInfo(&local_48,&local_68,100);
  ut::are_equal<agge::path_commands,int>((path_commands *)(local_78 + 1),local_78,&local_48);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

test( RectangleProducesIterator )
			{
				// INIT
				real_t x, y;

				// INIT / ACT
				rectangle r(10.0f, 20.0f, 30.0f, 40.0f);

				// ACT / ASSERT
				assert_equal(path_command_move_to, r.vertex(&x, &y));
				assert_equal(path_command_line_to, r.vertex(&x, &y));
				assert_equal(path_command_line_to, r.vertex(&x, &y));
				assert_equal(path_command_line_to, r.vertex(&x, &y));
				assert_equal(path_command_end_poly | path_flag_close, r.vertex(&x, &y));
				assert_equal(path_command_stop, r.vertex(&x, &y));
				assert_equal(path_command_stop, r.vertex(&x, &y));
			}